

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Instruction IVar1;
  randomx_flags rVar2;
  ostream *poVar3;
  randomx_argon2_impl *prVar4;
  runtime_error *prVar5;
  undefined8 *puVar6;
  ulong uVar7;
  size_type sVar8;
  reference pprVar9;
  atomic<unsigned_int> *paVar10;
  AtomicHash *pAVar11;
  Instruction in_RSI;
  char *pcVar12;
  double dVar13;
  MemoryException *e;
  exception *e_1;
  uint i_5;
  double elapsed;
  uint i_4;
  int cpuid;
  uint i_3;
  randomx_vm *vm;
  int i_2;
  uint i_1;
  uint32_t count;
  int i;
  uint32_t startItem;
  uint32_t remainder;
  uint32_t perThread;
  uint32_t datasetItemCount;
  Stopwatch sw;
  MineFunc *func;
  randomx_flags flags;
  randomx_cache *cache;
  randomx_dataset *dataset;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  AtomicHash result;
  atomic<unsigned_int> atomicNonce;
  char seed [4];
  int32_t seedValue;
  uint64_t threadAffinity;
  int initThreadCount;
  int threadCount;
  int noncesCount;
  bool noBatch;
  bool autoFlags;
  bool avx2;
  bool ssse3;
  bool secure;
  bool jit;
  bool largePages;
  bool help;
  bool verificationMode;
  bool miningMode;
  bool softAes;
  AtomicHash *in_stack_fffffffffffffc08;
  randomx_cache *in_stack_fffffffffffffc10;
  randomx_cache *in_stack_fffffffffffffc18;
  randomx_dataset *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  int argc_00;
  AtomicHash *in_stack_fffffffffffffc30;
  uint *in_stack_fffffffffffffc38;
  uint *in_stack_fffffffffffffc40;
  randomx_cache **in_stack_fffffffffffffc48;
  randomx_cache *in_stack_fffffffffffffc50;
  reference_wrapper<std::atomic<unsigned_int>_> *in_stack_fffffffffffffc58;
  thread *in_stack_fffffffffffffc60;
  value_type prVar14;
  _func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int
  **in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 uVar15;
  uint *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  randomx_flags in_stack_fffffffffffffc8c;
  uint in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  randomx_cache *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  uint64_t in_stack_fffffffffffffda8;
  uint local_174;
  uint local_154;
  undefined1 local_138 [8];
  randomx_vm *local_130;
  int local_128;
  uint local_124;
  code *local_120;
  int local_110;
  uint32_t local_10c;
  int local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  Instruction local_e0;
  string local_d8 [52];
  randomx_flags local_a4;
  Instruction local_a0;
  Instruction local_98;
  vector<std::thread,_std::allocator<std::thread>_> local_90;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> local_78 [2];
  undefined1 local_3c [4];
  undefined1 local_38 [4];
  uint32_t local_34;
  Instruction local_30;
  uint local_28;
  uint32_t local_24;
  int local_20;
  byte local_1b;
  byte local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  Instruction local_10;
  uint32_t local_4;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readIntOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                (char **)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,0);
  readUInt64Option((char *)in_stack_fffffffffffffc30,argc_00,(char **)in_stack_fffffffffffffc20,
                   (uint64_t *)in_stack_fffffffffffffc18,(uint64_t)in_stack_fffffffffffffc10);
  readIntOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                (char **)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,0);
  readIntOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                (char **)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,0);
  readIntOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                (char **)in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,0);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  if ((local_15 & 1) == 0) {
    readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  }
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  readOption((char *)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (char **)in_stack_fffffffffffffc10,(bool *)in_stack_fffffffffffffc08);
  store32(local_38,local_34);
  poVar3 = std::operator<<((ostream *)&std::cout,"RandomX benchmark v1.1.11");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if ((local_14 & 1) == 0) {
    if (((local_12 & 1) == 0) && ((local_13 & 1) == 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Please select either the fast mode (--mine) or the slow mode (--verify)"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Run \'");
      poVar3 = std::operator<<(poVar3,*(char **)local_10);
      poVar3 = std::operator<<(poVar3," --help\' to see all supported options");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
    else {
      memset(local_3c,0,4);
      AtomicHash::AtomicHash(in_stack_fffffffffffffc30);
      std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::vector
                ((vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> *)0x108bd4);
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)0x108be1);
      if ((local_1a & 1) == 0) {
        local_a4 = RANDOMX_FLAG_DEFAULT;
        if ((local_18 & 1) != 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                     (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        }
        if ((local_19 & 1) != 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                     (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        }
        if ((local_11 & 1) == 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                     (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        }
        if ((local_16 & 1) != 0) {
          operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                     (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        }
      }
      else {
        local_28 = std::thread::hardware_concurrency();
        local_a4 = randomx_get_flags();
      }
      if ((local_15 & 1) != 0) {
        operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                   (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      }
      if ((local_12 & 1) != 0) {
        operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                   (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      }
      if ((local_17 & 1) != 0) {
        operator|=((randomx_flags *)in_stack_fffffffffffffc10,
                   (randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      }
      rVar2 = operator&(local_a4,RANDOMX_FLAG_ARGON2_AVX2);
      if (rVar2 == RANDOMX_FLAG_DEFAULT) {
        rVar2 = operator&(local_a4,RANDOMX_FLAG_ARGON2_SSSE3);
        if (rVar2 == RANDOMX_FLAG_DEFAULT) {
          poVar3 = std::operator<<((ostream *)&std::cout," - Argon2 implementation: reference");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout," - Argon2 implementation: SSSE3");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout," - Argon2 implementation: AVX2");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      rVar2 = operator&(local_a4,RANDOMX_FLAG_FULL_MEM);
      if (rVar2 == RANDOMX_FLAG_DEFAULT) {
        poVar3 = std::operator<<((ostream *)&std::cout," - light memory mode (256 MiB)");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout," - full memory mode (2080 MiB)");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      rVar2 = operator&(local_a4,RANDOMX_FLAG_JIT);
      if (rVar2 == RANDOMX_FLAG_DEFAULT) {
        poVar3 = std::operator<<((ostream *)&std::cout," - interpreted mode");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout," - JIT compiled mode ");
        rVar2 = operator&(local_a4,RANDOMX_FLAG_SECURE);
        if (rVar2 != RANDOMX_FLAG_DEFAULT) {
          std::operator<<((ostream *)&std::cout,"(secure)");
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      rVar2 = operator&(local_a4,RANDOMX_FLAG_HARD_AES);
      if (rVar2 == RANDOMX_FLAG_DEFAULT) {
        poVar3 = std::operator<<((ostream *)&std::cout," - software AES mode");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout," - hardware AES mode");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      rVar2 = operator&(local_a4,RANDOMX_FLAG_LARGE_PAGES);
      if (rVar2 == RANDOMX_FLAG_DEFAULT) {
        poVar3 = std::operator<<((ostream *)&std::cout," - small pages mode");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout," - large pages mode");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      if (local_30 != (Instruction)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout," - thread affinity (");
        mask_to_string_abi_cxx11_(in_stack_fffffffffffffda8);
        poVar3 = std::operator<<(poVar3,local_d8);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_d8);
      }
      if ((local_1b & 1) == 0) {
        local_e0 = (Instruction)mine<true>;
        poVar3 = std::operator<<((ostream *)&std::cout," - batch mode");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_e0 = (Instruction)mine<false>;
      }
      std::operator<<((ostream *)&std::cout,"Initializing");
      if ((local_12 & 1) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout," (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
        poVar3 = std::operator<<(poVar3," thread");
        pcVar12 = ")";
        if (1 < (int)local_28) {
          pcVar12 = "s)";
        }
        std::operator<<(poVar3,pcVar12);
      }
      poVar3 = std::operator<<((ostream *)&std::cout," ...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      prVar4 = randomx::selectArgonImpl((randomx_flags)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      if (prVar4 == (randomx_argon2_impl *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Unsupported Argon2 implementation");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      operator&(local_a4,RANDOMX_FLAG_JIT);
      rVar2 = operator&(local_a4,RANDOMX_FLAG_JIT);
      if (rVar2 == RANDOMX_FLAG_DEFAULT) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "WARNING: You are using the interpreter mode. Use --jit for optimal performance."
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      Stopwatch::Stopwatch
                ((Stopwatch *)in_stack_fffffffffffffc10,
                 SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
      local_a0 = (Instruction)randomx_alloc_cache(in_stack_fffffffffffffc8c);
      if (local_a0 == (Instruction)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = 0;
        CacheAllocException::CacheAllocException((CacheAllocException *)in_stack_fffffffffffffc10);
        __cxa_throw(puVar6,&CacheAllocException::typeinfo,CacheAllocException::~CacheAllocException)
        ;
      }
      randomx_init_cache(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                         (size_t)in_stack_fffffffffffffc40);
      if ((local_12 & 1) != 0) {
        local_98 = (Instruction)
                   randomx_alloc_dataset((randomx_flags)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        if (local_98 == (Instruction)0x0) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = 0;
          DatasetAllocException::DatasetAllocException
                    ((DatasetAllocException *)in_stack_fffffffffffffc10);
          __cxa_throw(puVar6,&DatasetAllocException::typeinfo,
                      DatasetAllocException::~DatasetAllocException);
        }
        in_stack_fffffffffffffd58 = (randomx_cache *)randomx_dataset_item_count();
        local_fc = (uint)in_stack_fffffffffffffd58;
        if ((int)local_28 < 2) {
          randomx_init_dataset
                    (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                     (unsigned_long)in_stack_fffffffffffffc10,
                     (unsigned_long)in_stack_fffffffffffffc08);
        }
        else {
          local_100 = local_fc / local_28;
          local_104 = local_fc % local_28;
          local_108 = 0;
          for (local_10c = 0; (int)local_10c < (int)local_28; local_10c = local_10c + 1) {
            in_stack_fffffffffffffd50 = local_104;
            if (local_10c != local_28 - 1) {
              in_stack_fffffffffffffd50 = 0;
            }
            local_110 = local_100 + in_stack_fffffffffffffd50;
            local_120 = randomx_init_dataset;
            in_stack_fffffffffffffd54 = local_100;
            std::thread::
            thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                      (in_stack_fffffffffffffc60,
                       (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long
                        **)in_stack_fffffffffffffc58,(randomx_dataset **)in_stack_fffffffffffffc50,
                       in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38
                      );
            std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                      ((vector<std::thread,_std::allocator<std::thread>_> *)
                       in_stack_fffffffffffffc10,(value_type *)in_stack_fffffffffffffc08);
            std::thread::~thread((thread *)0x109690);
            local_108 = local_110 + local_108;
          }
          for (local_124 = 0; uVar7 = (ulong)local_124,
              sVar8 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_90),
              uVar7 < sVar8; local_124 = local_124 + 1) {
            std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                      (&local_90,(ulong)local_124);
            std::thread::join();
          }
        }
        randomx_release_cache(in_stack_fffffffffffffc10);
        local_a0.opcode = '\0';
        local_a0.dst = '\0';
        local_a0.src = '\0';
        local_a0.mod = '\0';
        local_a0.imm32 = 0;
        std::vector<std::thread,_std::allocator<std::thread>_>::clear
                  ((vector<std::thread,_std::allocator<std::thread>_> *)0x10979d);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Memory initialized in ");
      dVar13 = Stopwatch::getElapsed((Stopwatch *)0x1097c7);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar13);
      poVar3 = std::operator<<(poVar3," s");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Initializing ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
      poVar3 = std::operator<<(poVar3," virtual machine(s) ...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      for (local_128 = 0; local_128 < (int)local_24; local_128 = local_128 + 1) {
        local_130 = randomx_create_vm((randomx_flags)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                      in_stack_fffffffffffffd58,
                                      (randomx_dataset *)
                                      CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
        ;
        if (local_130 == (randomx_vm *)0x0) {
          rVar2 = operator&(local_a4,RANDOMX_FLAG_HARD_AES);
          if (rVar2 != RANDOMX_FLAG_DEFAULT) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar5,"Cannot create VM with the selected options. Try using --softAes");
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((local_15 & 1) == 0) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"Cannot create VM");
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"Cannot create VM with the selected options. Try without --largePages");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::push_back
                  ((vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> *)in_stack_fffffffffffffc20,
                   (value_type *)in_stack_fffffffffffffc18);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Running benchmark (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
      poVar3 = std::operator<<(poVar3," nonces) ...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Stopwatch::restart((Stopwatch *)in_stack_fffffffffffffc10);
      IVar1 = local_e0;
      if ((int)local_24 < 2) {
        uVar15 = 0;
        pprVar9 = std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::operator[](local_78,0);
        prVar14 = *pprVar9;
        std::ref<std::atomic<unsigned_int>>((atomic<unsigned_int> *)in_stack_fffffffffffffc08);
        paVar10 = std::reference_wrapper::operator_cast_to_atomic_
                            ((reference_wrapper<std::atomic<unsigned_int>_> *)0x109ecb);
        std::ref<AtomicHash>(in_stack_fffffffffffffc08);
        pAVar11 = std::reference_wrapper::operator_cast_to_AtomicHash_
                            ((reference_wrapper<AtomicHash> *)0x109ef2);
        (*(code *)IVar1)(prVar14,paVar10,pAVar11,local_20,uVar15,0xffffffff);
      }
      else {
        for (local_138._4_4_ = 0; uVar7 = (ulong)(uint)local_138._4_4_,
            sVar8 = std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::size(local_78),
            uVar7 < sVar8; local_138._4_4_ = local_138._4_4_ + 1) {
          local_138._0_4_ = 0xffffffff;
          if (local_30 != (Instruction)0x0) {
            local_138._0_4_ = cpuid_from_mask((uint64_t)local_30,(uint *)(local_138 + 4));
          }
          std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::operator[]
                    (local_78,(ulong)(uint)local_138._4_4_);
          std::ref<std::atomic<unsigned_int>>((atomic<unsigned_int> *)in_stack_fffffffffffffc08);
          std::ref<AtomicHash>(in_stack_fffffffffffffc08);
          in_stack_fffffffffffffc10 = (randomx_cache *)local_138;
          in_stack_fffffffffffffc08 = (AtomicHash *)(local_138 + 4);
          std::thread::
          thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                    ((thread *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68,(randomx_vm **)in_stack_fffffffffffffc60,
                     in_stack_fffffffffffffc58,
                     (reference_wrapper<AtomicHash> *)in_stack_fffffffffffffc50,
                     (int *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc80,
                     (int *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                    ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc10,
                     (value_type *)in_stack_fffffffffffffc08);
          std::thread::~thread((thread *)0x109c62);
        }
        local_154 = 0;
        while( true ) {
          uVar7 = (ulong)local_154;
          sVar8 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_90);
          if (sVar8 <= uVar7) break;
          std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                    (&local_90,(ulong)local_154);
          std::thread::join();
          local_154 = local_154 + 1;
        }
      }
      dVar13 = Stopwatch::getElapsed((Stopwatch *)0x109f29);
      local_174 = 0;
      while( true ) {
        uVar7 = (ulong)local_174;
        sVar8 = std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::size(local_78);
        if (sVar8 <= uVar7) break;
        std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::operator[]
                  (local_78,(ulong)local_174);
        randomx_destroy_vm((randomx_vm *)in_stack_fffffffffffffc10);
        local_174 = local_174 + 1;
      }
      if ((local_12 & 1) == 0) {
        randomx_release_cache(in_stack_fffffffffffffc10);
      }
      else {
        randomx_release_dataset((randomx_dataset *)in_stack_fffffffffffffc10);
      }
      std::operator<<((ostream *)&std::cout,"Calculated result: ");
      AtomicHash::print((AtomicHash *)in_stack_fffffffffffffc20,(ostream *)in_stack_fffffffffffffc18
                       );
      if ((local_20 == 1000) && (local_34 == 0)) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Reference result:  10b649a3f15c7c7f88277812f2e74b337a0f20ce909af09199cccb960771cfa1"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      if ((local_12 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Performance: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(dVar13 * 1000.0) / (double)local_20);
        poVar3 = std::operator<<(poVar3," ms per hash");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Performance: ");
        in_stack_fffffffffffffc20 =
             (randomx_dataset *)std::ostream::operator<<(poVar3,(double)local_20 / dVar13);
        poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffc20," hashes per second");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      local_4 = 0;
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc20);
      std::vector<randomx_vm_*,_std::allocator<randomx_vm_*>_>::~vector
                ((vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> *)in_stack_fffffffffffffc20);
    }
  }
  else {
    printUsage((char *)0x108b08);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.1.11" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		func = &mine<false>;
	}
	else {
		func = &mine<true>;
		std::cout << " - batch mode" << std::endl;
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0)
			std::cout << "Reference result:  10b649a3f15c7c7f88277812f2e74b337a0f20ce909af09199cccb960771cfa1" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}